

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  _Bool _Var1;
  char cVar2;
  CURLcode CVar3;
  CURLUcode CVar4;
  Curl_handler *pCVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  bool local_109;
  size_t local_108;
  size_t n;
  dynbuf enc_1;
  _Bool addamperand;
  size_t querylen;
  char *p;
  undefined1 local_a8 [4];
  CURLcode result_1;
  dynbuf enc;
  uchar *i;
  size_t nalloc;
  char *newp;
  char *redired_url;
  char *oldurl;
  char *pcStack_58;
  CURLUcode result;
  char *endp;
  size_t len;
  _Bool equalsencode;
  _Bool appendquery;
  _Bool urlskipslash;
  _Bool plusencode;
  long lStack_40;
  _Bool urlencode;
  long port;
  char **storep;
  char *pcStack_28;
  uint flags_local;
  char *part_local;
  CURLU *pCStack_18;
  CURLUPart what_local;
  CURLU *u_local;
  
  port = 0;
  lStack_40 = 0;
  len._7_1_ = (flags & 0x80) != 0;
  len._6_1_ = 0;
  len._5_1_ = 0;
  len._4_1_ = 0;
  len._3_1_ = 0;
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  storep._4_4_ = flags;
  pcStack_28 = part;
  part_local._4_4_ = what;
  pCStack_18 = u;
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      port = (long)u;
      break;
    case CURLUPART_USER:
      port = (long)&u->user;
      break;
    case CURLUPART_PASSWORD:
      port = (long)&u->password;
      break;
    case CURLUPART_OPTIONS:
      port = (long)&u->options;
      break;
    case CURLUPART_HOST:
      port = (long)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      port = (long)&u->port;
      break;
    case CURLUPART_PATH:
      port = (long)&u->path;
      break;
    case CURLUPART_QUERY:
      port = (long)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      port = (long)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      port = (long)&u->zoneid;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if ((port == 0) || (*(long *)port == 0)) {
      if (port == 0) {
        free_urlhandle(u);
        memset(pCStack_18,0,0x58);
      }
    }
    else {
      (*Curl_cfree)(*(void **)port);
      *(undefined8 *)port = 0;
    }
    return CURLUE_OK;
  }
  switch(what) {
  case CURLUPART_URL:
    sVar6 = Curl_is_absolute_url(part,(char *)0x0,0,(flags & 0x204) != 0);
    if ((sVar6 == 0) &&
       (CVar4 = curl_url_get(pCStack_18,CURLUPART_URL,&redired_url,storep._4_4_), CVar4 == CURLUE_OK
       )) {
      pcVar8 = concat_url(redired_url,pcStack_28);
      (*Curl_cfree)(redired_url);
      if (pcVar8 == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      oldurl._4_4_ = parseurl_and_replace(pcVar8,pCStack_18,storep._4_4_);
      (*Curl_cfree)(pcVar8);
      return oldurl._4_4_;
    }
    CVar4 = parseurl_and_replace(pcStack_28,pCStack_18,storep._4_4_);
    return CVar4;
  case CURLUPART_SCHEME:
    sVar7 = strlen(part);
    if (0x28 < sVar7) {
      return CURLUE_BAD_SCHEME;
    }
    if (((storep._4_4_ & 8) == 0) &&
       (pCVar5 = Curl_builtin_scheme(pcStack_28,0xffffffffffffffff), pCVar5 == (Curl_handler *)0x0))
    {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    port = (long)pCStack_18;
    len._7_1_ = 0;
    break;
  case CURLUPART_USER:
    port = (long)&u->user;
    break;
  case CURLUPART_PASSWORD:
    port = (long)&u->password;
    break;
  case CURLUPART_OPTIONS:
    port = (long)&u->options;
    break;
  case CURLUPART_HOST:
    endp = (char *)strcspn(part," \r\n");
    pcVar8 = (char *)strlen(pcStack_28);
    if (pcVar8 != endp) {
      return CURLUE_BAD_HOSTNAME;
    }
    port = (long)&pCStack_18->host;
    (*Curl_cfree)(pCStack_18->zoneid);
    pCStack_18->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    len._7_1_ = 0;
    lStack_40 = strtol(part,&stack0xffffffffffffffa8,10);
    if ((lStack_40 < 1) || (0xffff < lStack_40)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*pcStack_58 != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    port = (long)&pCStack_18->port;
    break;
  case CURLUPART_PATH:
    len._5_1_ = 1;
    port = (long)&u->path;
    break;
  case CURLUPART_QUERY:
    len._3_1_ = (flags & 0x100) != 0;
    port = (long)&u->query;
    len._4_1_ = len._3_1_;
    len._6_1_ = len._7_1_;
    break;
  case CURLUPART_FRAGMENT:
    port = (long)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    port = (long)&u->zoneid;
    break;
  default:
    return CURLUE_UNKNOWN_PART;
  }
  sVar7 = strlen(pcStack_28);
  if (sVar7 < 0x7a1201) {
    if ((len._7_1_ & 1) == 0) {
      nalloc = (size_t)(*Curl_cstrdup)(pcStack_28);
      querylen = nalloc;
      if ((char *)nalloc == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      while (*(char *)querylen != '\0') {
        if ((((*(char *)querylen == '%') &&
             (((('/' < *(char *)(querylen + 1) && (*(char *)(querylen + 1) < ':')) ||
               (('`' < *(char *)(querylen + 1) && (*(char *)(querylen + 1) < 'g')))) ||
              (('@' < *(char *)(querylen + 1) && (*(char *)(querylen + 1) < 'G')))))) &&
            ((('/' < *(char *)(querylen + 2) && (*(char *)(querylen + 2) < ':')) ||
             ((('`' < *(char *)(querylen + 2) && (*(char *)(querylen + 2) < 'g')) ||
              (('@' < *(char *)(querylen + 2) && (*(char *)(querylen + 2) < 'G')))))))) &&
           ((('@' < *(char *)(querylen + 1) && (*(char *)(querylen + 1) < '[')) ||
            (('@' < *(char *)(querylen + 2) && (*(char *)(querylen + 2) < '[')))))) {
          cVar2 = Curl_raw_tolower(*(char *)(querylen + 1));
          *(char *)(querylen + 1) = cVar2;
          cVar2 = Curl_raw_tolower(*(char *)(querylen + 2));
          *(char *)(querylen + 2) = cVar2;
          querylen = querylen + 3;
        }
        else {
          querylen = querylen + 1;
        }
      }
    }
    else {
      Curl_dyn_init((dynbuf *)local_a8,sVar7 * 3 + 1);
      for (enc.toobig = (size_t)pcStack_28; *(char *)enc.toobig != '\0'; enc.toobig = enc.toobig + 1
          ) {
        if ((*(char *)enc.toobig == ' ') && ((len._6_1_ & 1) != 0)) {
          CVar3 = Curl_dyn_addn((dynbuf *)local_a8,"+",1);
          if (CVar3 != CURLE_OK) {
            return CURLUE_OUT_OF_MEMORY;
          }
        }
        else {
          _Var1 = Curl_isunreserved(*(uchar *)enc.toobig);
          if (((_Var1) || ((*(char *)enc.toobig == '/' && ((len._5_1_ & 1) != 0)))) ||
             ((*(char *)enc.toobig == '=' && ((len._3_1_ & 1) != 0)))) {
            if ((*(char *)enc.toobig == '=') && ((len._3_1_ & 1) != 0)) {
              len._3_1_ = 0;
            }
            CVar3 = Curl_dyn_addn((dynbuf *)local_a8,(void *)enc.toobig,1);
            if (CVar3 != CURLE_OK) {
              return CURLUE_OUT_OF_MEMORY;
            }
          }
          else {
            CVar3 = Curl_dyn_addf((dynbuf *)local_a8,"%%%02x",(ulong)*(byte *)enc.toobig);
            if (CVar3 != CURLE_OK) {
              return CURLUE_OUT_OF_MEMORY;
            }
          }
        }
      }
      nalloc = (size_t)Curl_dyn_ptr((dynbuf *)local_a8);
    }
    if ((len._4_1_ & 1) != 0) {
      if (pCStack_18->query == (char *)0x0) {
        local_108 = 0;
      }
      else {
        local_108 = strlen(pCStack_18->query);
      }
      local_109 = false;
      if (local_108 != 0) {
        local_109 = pCStack_18->query[local_108 - 1] != '&';
      }
      enc_1.toobig._7_1_ = local_109;
      if (local_108 != 0) {
        Curl_dyn_init((dynbuf *)&n,8000000);
        CVar3 = Curl_dyn_addn((dynbuf *)&n,pCStack_18->query,local_108);
        if ((CVar3 == CURLE_OK) &&
           ((((enc_1.toobig._7_1_ & 1) == 0 ||
             (CVar3 = Curl_dyn_addn((dynbuf *)&n,"&",1), CVar3 == CURLE_OK)) &&
            (CVar3 = Curl_dyn_add((dynbuf *)&n,(char *)nalloc), CVar3 == CURLE_OK)))) {
          (*Curl_cfree)((void *)nalloc);
          (*Curl_cfree)(*(void **)port);
          pcVar8 = Curl_dyn_ptr((dynbuf *)&n);
          *(char **)port = pcVar8;
          return CURLUE_OK;
        }
        (*Curl_cfree)((void *)nalloc);
        return CURLUE_OUT_OF_MEMORY;
      }
    }
    if (((part_local._4_4_ == CURLUPART_HOST) &&
        ((sVar7 = strlen((char *)nalloc), sVar7 != 0 || ((storep._4_4_ & 0x400) == 0)))) &&
       (CVar4 = hostname_check(pCStack_18,(char *)nalloc,sVar7), CVar4 != CURLUE_OK)) {
      (*Curl_cfree)((void *)nalloc);
      u_local._4_4_ = CURLUE_BAD_HOSTNAME;
    }
    else {
      (*Curl_cfree)(*(void **)port);
      *(size_t *)port = nalloc;
      if (lStack_40 != 0) {
        pCStack_18->portnum = lStack_40;
      }
      u_local._4_4_ = CURLUE_OK;
    }
  }
  else {
    u_local._4_4_ = CURLUE_MALFORMED_INPUT;
  }
  return u_local._4_4_;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(strlen(part) > MAX_SCHEME_LEN)
      /* too long */
      return CURLUE_BAD_SCHEME;
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part, CURL_ZERO_TERMINATED))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST: {
    size_t len = strcspn(part, " \r\n");
    if(strlen(part) != len)
      /* hostname with bad content */
      return CURLUE_BAD_HOSTNAME;
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  }
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
  {
    char *endp;
    urlencode = FALSE; /* never */
    port = strtol(part, &endp, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    if(*endp)
      /* weirdly provided number, not good! */
      return CURLUE_BAD_PORT_NUMBER;
    storep = &u->port;
  }
  break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;

    /* if the new thing is absolute or the old one is not
     * (we could not get an absolute url in 'oldurl'),
     * then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|
                                     CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }

    /* apply the relative part to create a new URL
     * and replace the existing one with it. */
    redired_url = concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    result = parseurl_and_replace(redired_url, u, flags);
    free(redired_url);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(nalloc > CURL_MAX_INPUT_LENGTH)
      /* excessive input length */
      return CURLUE_MALFORMED_INPUT;

    if(urlencode) {
      const unsigned char *i;
      struct dynbuf enc;

      Curl_dyn_init(&enc, nalloc * 3 + 1);

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(Curl_isunreserved(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else {
          result = Curl_dyn_addf(&enc, "%%%02x", *i);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
      }
      newp = Curl_dyn_ptr(&enc);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf enc;
        Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&enc, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&enc, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&enc, newp))
          goto nomem;
        free((char *)newp);
        free(*storep);
        *storep = Curl_dyn_ptr(&enc);
        return CURLUE_OK;
        nomem:
        free((char *)newp);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    if(what == CURLUPART_HOST) {
      size_t n = strlen(newp);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it's allowed to be empty. */
      }
      else {
        if(hostname_check(u, (char *)newp, n)) {
          free((char *)newp);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}